

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.hpp
# Opt level: O0

bool boost::unit_test::operator<(basic_cstring<const_char> *x,basic_cstring<const_char> *y)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_iterator n;
  const_iterator cstr2;
  basic_cstring<const_char> *in_RSI;
  basic_cstring<const_char> *in_RDI;
  const_char *in_stack_ffffffffffffffd8;
  undefined1 local_19;
  
  sVar2 = basic_cstring<const_char>::size(in_RDI);
  sVar3 = basic_cstring<const_char>::size(in_RSI);
  if (sVar2 == sVar3) {
    n = basic_cstring<const_char>::begin(in_RDI);
    cstr2 = basic_cstring<const_char>::begin(in_RSI);
    basic_cstring<const_char>::size(in_RDI);
    iVar1 = ut_detail::bcs_char_traits_impl<const_char>::compare
                      (in_stack_ffffffffffffffd8,cstr2,(size_t)n);
    local_19 = iVar1 < 0;
  }
  else {
    sVar2 = basic_cstring<const_char>::size(in_RDI);
    sVar3 = basic_cstring<const_char>::size(in_RSI);
    local_19 = sVar2 < sVar3;
  }
  return local_19;
}

Assistant:

inline bool
operator <( boost::unit_test::basic_cstring<CharT> const& x,
            boost::unit_test::basic_cstring<CharT> const& y )
{
    typedef typename boost::unit_test::basic_cstring<CharT>::traits_type traits_type;
    return x.size() != y.size()
            ? x.size() < y.size()
            : traits_type::compare( x.begin(), y.begin(), x.size() ) < 0;
}